

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QRenderRule::drawBackground(QRenderRule *this,QPainter *p,QRect *rect,QPoint *off)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  Origin origin;
  long in_FS_OFFSET;
  QRect r;
  QRect QVar4;
  QRect local_58;
  undefined1 local_48 [8];
  QBrush brush;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _brush = &DAT_aaaaaaaaaaaaaaaa;
  bVar2 = hasBackground(this);
  if (bVar2) {
    QBrush::QBrush(&brush,&((this->bg).d.ptr)->brush);
  }
  else {
    QBrush::QBrush(&brush);
  }
  if (*(int *)(_brush + 4) == 0) {
    QBrush::operator=(&brush,&this->defaultBackground);
    if (*(int *)(_brush + 4) == 0) goto LAB_003411ae;
  }
  bVar2 = hasBackground(this);
  if (bVar2) {
    origin = ((this->bg).d.ptr)->clip;
  }
  else {
    origin = Origin_Border;
  }
  QVar4 = originRect(this,rect,origin);
  r.x2.m_i = (int)QVar4._0_8_;
  r.y2.m_i = (int)((ulong)QVar4._0_8_ >> 0x20);
  r._0_8_ = this;
  borderClip((QRenderRule *)local_48,r);
  cVar3 = QPainterPath::isEmpty();
  if (cVar3 == '\0') {
    QPainter::renderHints();
    QPainter::setRenderHint((RenderHint)p,true);
    QPainter::fillPath((QPainterPath *)p,(QBrush *)local_48);
    QPainter::setRenderHint((RenderHint)p,true);
  }
  else {
    local_58 = originRect(this,rect,origin);
    QPainter::fillRect((QRect *)p,(QBrush *)&local_58);
  }
  QPainterPath::~QPainterPath((QPainterPath *)local_48);
LAB_003411ae:
  drawBackgroundImage(this,p,rect,*off);
  QBrush::~QBrush(&brush);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::drawBackground(QPainter *p, const QRect& rect, const QPoint& off)
{
    QBrush brush = hasBackground() ? background()->brush : QBrush();
    if (brush.style() == Qt::NoBrush)
        brush = defaultBackground;

    if (brush.style() != Qt::NoBrush) {
        Origin origin = hasBackground() ? background()->clip : Origin_Border;
        // ### fix for  gradients
        const QPainterPath &borderPath = borderClip(originRect(rect, origin));
        if (!borderPath.isEmpty()) {
            // Drawn instead of being used as clipping path for better visual quality
            bool wasAntialiased = p->renderHints() & QPainter::Antialiasing;
            p->setRenderHint(QPainter::Antialiasing);
            p->fillPath(borderPath, brush);
            p->setRenderHint(QPainter::Antialiasing, wasAntialiased);
        } else {
            p->fillRect(originRect(rect, origin), brush);
        }
    }

    drawBackgroundImage(p, rect, off);
}